

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebm_util.cc
# Opt level: O2

bool libwebm::ParseVP9SuperFrameIndex
               (uint8_t *frame,size_t frame_length,Ranges *frame_ranges,bool *error)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  byte *pbVar11;
  size_t sVar12;
  size_t sStack_70;
  Range local_40;
  
  if ((error == (bool *)0x0 || frame_ranges == (Ranges *)0x0) ||
      (frame_length == 0 || frame == (uint8_t *)0x0)) {
    return false;
  }
  bVar1 = frame[frame_length - 1];
  if ((bVar1 & 0xe0) != 0xc0) {
    return false;
  }
  iVar8 = (bVar1 & 7) + 1;
  uVar5 = (ulong)(((bVar1 >> 3 & 3) + 1) * iVar8 + 2);
  uVar10 = frame_length - uVar5;
  if (frame_length < uVar5) {
    pcVar9 = "VP9ParseSuperFrameIndex: Invalid superframe index size.\n";
    sStack_70 = 0x38;
  }
  else {
    if ((uVar5 <= uVar10) && (frame[uVar10] == bVar1)) {
      pbVar11 = frame + uVar10 + 1;
      uVar2 = bVar1 >> 3 & 3;
      sVar12 = 0;
      for (iVar7 = 0; iVar7 != iVar8; iVar7 = iVar7 + 1) {
        uVar3 = 0;
        pbVar6 = pbVar11;
        for (iVar4 = 0; uVar2 * 8 + 8 != iVar4; iVar4 = iVar4 + 8) {
          bVar1 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar3 = uVar3 | (uint)bVar1 << ((byte)iVar4 & 0x1f);
        }
        uVar5 = (ulong)uVar3;
        if (uVar10 - sVar12 < uVar5) {
          pcVar9 = 
          "ParseVP9SuperFrameIndex: Invalid superframe, sub frame larger than entire frame.\n";
          sStack_70 = 0x51;
          goto LAB_0010b85b;
        }
        pbVar11 = pbVar11 + (ulong)uVar2 + 1;
        local_40.offset = sVar12;
        local_40.length = uVar5;
        std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::emplace_back<libwebm::Range>
                  (frame_ranges,&local_40);
        sVar12 = sVar12 + uVar5;
      }
      if (iVar8 == (int)((ulong)((long)(frame_ranges->
                                       super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(frame_ranges->
                                      super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        return true;
      }
      pcVar9 = "VP9Parse: superframe index parse failed.\n";
      sStack_70 = 0x29;
LAB_0010b85b:
      fwrite(pcVar9,sStack_70,1,_stderr);
      goto LAB_0010b869;
    }
    pcVar9 = "VP9Parse: Invalid superframe index.\n";
    sStack_70 = 0x24;
  }
  fwrite(pcVar9,sStack_70,1,_stderr);
LAB_0010b869:
  *error = true;
  return false;
}

Assistant:

bool ParseVP9SuperFrameIndex(const std::uint8_t* frame,
                             std::size_t frame_length, Ranges* frame_ranges,
                             bool* error) {
  if (frame == nullptr || frame_length == 0 || frame_ranges == nullptr ||
      error == nullptr) {
    return false;
  }

  bool parse_ok = false;
  const std::uint8_t marker = frame[frame_length - 1];
  const std::uint32_t kHasSuperFrameIndexMask = 0xe0;
  const std::uint32_t kSuperFrameMarker = 0xc0;
  const std::uint32_t kLengthFieldSizeMask = 0x3;

  if ((marker & kHasSuperFrameIndexMask) == kSuperFrameMarker) {
    const std::uint32_t kFrameCountMask = 0x7;
    const int num_frames = (marker & kFrameCountMask) + 1;
    const int length_field_size = ((marker >> 3) & kLengthFieldSizeMask) + 1;
    const std::size_t index_length = 2 + length_field_size * num_frames;

    if (frame_length < index_length) {
      std::fprintf(stderr,
                   "VP9ParseSuperFrameIndex: Invalid superframe index size.\n");
      *error = true;
      return false;
    }

    // Consume the super frame index. Note: it's at the end of the super frame.
    const std::size_t length = frame_length - index_length;

    if (length >= index_length &&
        frame[frame_length - index_length] == marker) {
      // Found a valid superframe index.
      const std::uint8_t* byte = frame + length + 1;

      std::size_t frame_offset = 0;

      for (int i = 0; i < num_frames; ++i) {
        std::uint32_t child_frame_length = 0;

        for (int j = 0; j < length_field_size; ++j) {
          child_frame_length |= (*byte++) << (j * 8);
        }

        if (length - frame_offset < child_frame_length) {
          std::fprintf(stderr,
                       "ParseVP9SuperFrameIndex: Invalid superframe, sub frame "
                       "larger than entire frame.\n");
          *error = true;
          return false;
        }

        frame_ranges->push_back(Range(frame_offset, child_frame_length));
        frame_offset += child_frame_length;
      }

      if (static_cast<int>(frame_ranges->size()) != num_frames) {
        std::fprintf(stderr, "VP9Parse: superframe index parse failed.\n");
        *error = true;
        return false;
      }

      parse_ok = true;
    } else {
      std::fprintf(stderr, "VP9Parse: Invalid superframe index.\n");
      *error = true;
    }
  }
  return parse_ok;
}